

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ip6-addr.c
# Opt level: O2

int run_test_ip6_addr_link_local(void)

{
  uint ifindex;
  uv_interface_address_t *puVar1;
  int iVar2;
  uv_loop_t *puVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  undefined8 uStack_150;
  int count;
  size_t scoped_addr_len;
  size_t interface_id_len;
  uv_interface_address_t *addresses;
  sockaddr_in6 addr;
  char interface_id [17];
  char string_address [46];
  char scoped_addr [128];
  
  iVar2 = uv_interface_addresses(&addresses,&count);
  if (iVar2 == 0) {
    lVar6 = 0x1c;
    lVar5 = 0;
    while( true ) {
      puVar1 = addresses;
      if (count <= lVar5) break;
      if (*(short *)(addresses->phys_addr + lVar6 + -0x10) == 10) {
        iVar2 = uv_inet_ntop(10,addresses->phys_addr + lVar6 + -8,string_address,0x2e);
        if (iVar2 != 0) {
          pcVar4 = 
          "0 == uv_inet_ntop(AF_INET6, &address->address.address6.sin6_addr, string_address, sizeof(string_address))"
          ;
          uStack_150 = 0x41;
          goto LAB_00134bb9;
        }
        iVar2 = bcmp(string_address,"fe80::",6);
        if (iVar2 == 0) {
          ifindex = *(uint *)(puVar1->phys_addr + lVar6 + 8);
          pcVar4 = *(char **)(puVar1->phys_addr + lVar6 + -0x24);
          scoped_addr_len = 0x80;
          iVar2 = uv_if_indextoname(ifindex,scoped_addr,&scoped_addr_len);
          if (iVar2 != 0) {
            pcVar4 = "0 == uv_if_indextoname(iface_index, scoped_addr, &scoped_addr_len)";
            uStack_150 = 0x4b;
            goto LAB_00134bb9;
          }
          iVar2 = strcmp(pcVar4,scoped_addr);
          if (iVar2 != 0) {
            pcVar4 = "0 == strcmp(device_name, scoped_addr)";
            uStack_150 = 0x4e;
            goto LAB_00134bb9;
          }
          interface_id_len = 0x11;
          iVar2 = uv_if_indextoiid(ifindex,interface_id,&interface_id_len);
          if (iVar2 != 0) {
            pcVar4 = "0 == r";
            uStack_150 = 0x53;
            goto LAB_00134bb9;
          }
          iVar2 = strcmp(pcVar4,interface_id);
          if (iVar2 != 0) {
            pcVar4 = "0 == strcmp(device_name, interface_id)";
            uStack_150 = 0x59;
            goto LAB_00134bb9;
          }
          snprintf(scoped_addr,0x80,"%s%%%s",string_address,interface_id);
          fprintf(_stderr,"Testing link-local address %s (iface_index: 0x%02x, device_name: %s)\n",
                  scoped_addr,(ulong)ifindex,pcVar4);
          fflush(_stderr);
          iVar2 = uv_ip6_addr(scoped_addr,0x23a3,&addr);
          if (iVar2 != 0) {
            pcVar4 = "0 == uv_ip6_addr(scoped_addr, TEST_PORT, &addr)";
            uStack_150 = 0x69;
            goto LAB_00134bb9;
          }
          fprintf(_stderr,"Got scope_id 0x%02x\n",(ulong)addr.sin6_scope_id);
          fflush(_stderr);
          if (ifindex != addr.sin6_scope_id) {
            pcVar4 = "iface_index == addr.sin6_scope_id";
            uStack_150 = 0x6c;
            goto LAB_00134bb9;
          }
        }
      }
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x50;
    }
    uv_free_interface_addresses(addresses,count);
    scoped_addr_len = 0x80;
    iVar2 = uv_if_indextoname(0xffffffff,scoped_addr,&scoped_addr_len);
    if (iVar2 == 0) {
      pcVar4 = "0 != uv_if_indextoname((unsigned int)-1, scoped_addr, &scoped_addr_len)";
      uStack_150 = 0x72;
    }
    else {
      puVar3 = uv_default_loop();
      close_loop(puVar3);
      puVar3 = uv_default_loop();
      iVar2 = uv_loop_close(puVar3);
      if (iVar2 == 0) {
        return 0;
      }
      pcVar4 = "0 == uv_loop_close(uv_default_loop())";
      uStack_150 = 0x74;
    }
  }
  else {
    pcVar4 = "0 == uv_interface_addresses(&addresses, &count)";
    uStack_150 = 0x36;
  }
LAB_00134bb9:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
          ,uStack_150,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(ip6_addr_link_local) {
#if defined(__CYGWIN__) || defined(__MSYS__)
  /* FIXME: Does Cygwin support this?  */
  RETURN_SKIP("FIXME: This test needs more investigation on Cygwin");
#endif
  char string_address[INET6_ADDRSTRLEN];
  uv_interface_address_t* addresses;
  uv_interface_address_t* address;
  struct sockaddr_in6 addr;
  unsigned int iface_index;
  const char* device_name;
  /* 40 bytes address, 16 bytes device name, plus reserve. */
  char scoped_addr[128];
  size_t scoped_addr_len;
  char interface_id[UV_IF_NAMESIZE];
  size_t interface_id_len;
  int count;
  int ix;
  int r;

  ASSERT(0 == uv_interface_addresses(&addresses, &count));

  for (ix = 0; ix < count; ix++) {
    address = addresses + ix;

    if (address->address.address6.sin6_family != AF_INET6)
      continue;

    ASSERT(0 == uv_inet_ntop(AF_INET6,
                             &address->address.address6.sin6_addr,
                             string_address,
                             sizeof(string_address)));

    /* Skip addresses that are not link-local. */
    if (strncmp(string_address, "fe80::", 6) != 0)
      continue;

    iface_index = address->address.address6.sin6_scope_id;
    device_name = address->name;

    scoped_addr_len = sizeof(scoped_addr);
    ASSERT(0 == uv_if_indextoname(iface_index, scoped_addr, &scoped_addr_len));
#ifndef _WIN32
    /* This assert fails on Windows, as Windows semantics are different. */
    ASSERT(0 == strcmp(device_name, scoped_addr));
#endif

    interface_id_len = sizeof(interface_id);
    r = uv_if_indextoiid(iface_index, interface_id, &interface_id_len);
    ASSERT(0 == r);
#ifdef _WIN32
    /* On Windows, the interface identifier is the numeric string of the index. */
    ASSERT(strtoul(interface_id, NULL, 10) == iface_index);
#else
    /* On Unix/Linux, the interface identifier is the interface device name. */
    ASSERT(0 == strcmp(device_name, interface_id));
#endif

    snprintf(scoped_addr,
             sizeof(scoped_addr),
             "%s%%%s",
             string_address,
             interface_id);

    fprintf(stderr, "Testing link-local address %s "
            "(iface_index: 0x%02x, device_name: %s)\n",
            scoped_addr,
            iface_index,
            device_name);
    fflush(stderr);

    ASSERT(0 == uv_ip6_addr(scoped_addr, TEST_PORT, &addr));
    fprintf(stderr, "Got scope_id 0x%02x\n", addr.sin6_scope_id);
    fflush(stderr);
    ASSERT(iface_index == addr.sin6_scope_id);
  }

  uv_free_interface_addresses(addresses, count);

  scoped_addr_len = sizeof(scoped_addr);
  ASSERT(0 != uv_if_indextoname((unsigned int)-1, scoped_addr, &scoped_addr_len));

  MAKE_VALGRIND_HAPPY();
  return 0;
}